

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O2

void __thiscall kwssys::RegularExpression::RegularExpression(RegularExpression *this,char *s)

{
  this->regmust = (char *)0x0;
  this->program = (char *)0x0;
  this->progsize = 0;
  memset(this,0,0x20a);
  if (s != (char *)0x0) {
    compile(this,s);
    return;
  }
  return;
}

Assistant:

inline RegularExpression::RegularExpression(const char* s)
  : regstart{}
  , reganch{}
  , regmust{}
  , program{ nullptr }
  , progsize{}
{
  if (s) {
    this->compile(s);
  }
}